

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

int keyword(void)

{
  char cVar1;
  ushort uVar2;
  char *cptr;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  void *pvVar6;
  long lVar7;
  
  cptr = ::cptr;
  cVar1 = ::cptr[1];
  lVar7 = (long)cVar1;
  ::cptr = ::cptr + 1;
  ppuVar5 = __ctype_b_loc();
  uVar2 = (*ppuVar5)[lVar7];
  if ((uVar2 >> 10 & 1) == 0) {
    ::cptr = cptr + 2;
    if (cVar1 == '$') {
      return 8;
    }
    if (cVar1 != '%') {
      if (cVar1 == '0') goto LAB_00112807;
      if (cVar1 == '2') {
        return 3;
      }
      if (cVar1 == '{') {
        return 5;
      }
      if (cVar1 == '>') {
        return 2;
      }
      if (cVar1 == '@') {
        return 0xb;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '<') {
          return 1;
        }
        goto LAB_001127ee;
      }
    }
    iVar4 = 4;
  }
  else {
    cinc = 0;
    while (((uVar2 & 8) != 0 ||
           ((uVar3 = ((uint)lVar7 & 0xff) - 0x24, uVar3 < 0x3c &&
            ((0x800000000000401U >> ((ulong)uVar3 & 0x3f) & 1) != 0))))) {
      iVar4 = tolower((int)(char)lVar7);
      cachec(iVar4);
      lVar7 = (long)::cptr[1];
      uVar2 = (*ppuVar5)[lVar7];
      ::cptr = ::cptr + 1;
    }
    cachec(0);
    pvVar6 = bsearch(cache,keywords,0xd,0x10,strcmp);
    if (pvVar6 != (void *)0x0) {
      return *(int *)((long)pvVar6 + 0xc);
    }
LAB_001127ee:
    syntax_error(input_file->lineno,line,cptr);
LAB_00112807:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int keyword()
{
  register int	c;
  char		*t_cptr = cptr;
  struct keyword	*key;

  c = *++cptr;
  if (isalpha(c)) {
    cinc = 0;
    while (isalnum(c) || c == '_' || c == '.' || c == '$') {
      cachec(tolower(c));
      c = *++cptr;
    }
    cachec(NUL);

    if ((key = bsearch(cache, keywords, sizeof(keywords)/sizeof(*key),
		       sizeof(*key),
		       (int (*)(const void *, const void *))strcmp)))
      return key->token;
  } else {
    ++cptr;
    if (c == '{') return (TEXT);
    if (c == '%' || c == '\\') return (MARK);
    if (c == '<') return (LEFT);
    if (c == '>') return (RIGHT);
    if (c == '0') return (TOKEN);
    if (c == '2') return (NONASSOC);
    if (c == '@') return (LOCATION);
    if (c == '$') return (UNION);
  }
  syntax_error(input_file->lineno, line, t_cptr);
  /*NOTREACHED*/
  return 0;
}